

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwrapper.cpp
# Opt level: O2

void deleteFixedEnvelope(void *t,bool release_everything)

{
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,release_everything) == 0) {
    if (t == (void *)0x0) {
      return;
    }
  }
  else {
    *(undefined8 *)((long)t + 8) = 0;
    *(undefined8 *)((long)t + 0x10) = 0;
    *(undefined8 *)((long)t + 0x18) = 0;
  }
  (**(code **)(*t + 8))();
  return;
}

Assistant:

void deleteFixedEnvelope(void* t, bool release_everything)
{
    FixedEnvelope* tt = reinterpret_cast<FixedEnvelope*>(t);
    if(release_everything)
    {
        tt->release_masses();
        tt->release_probs();
        tt->release_confs();
    }
    delete tt;
}